

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::yml::Tree::duplicate_children_no_rep
          (Tree *this,Tree *src,size_t node,size_t parent,size_t after)

{
  pfn_error p_Var1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  error_flags eVar7;
  int iVar8;
  csubstr *pcVar9;
  char *in_RCX;
  long in_RDX;
  Tree *in_RDI;
  char *in_R8;
  size_t jcount;
  size_t j;
  size_t rep_pos;
  size_t rep;
  char msg_4 [31];
  size_t icount_1;
  size_t i_1;
  size_t prev;
  char msg_3 [34];
  size_t icount;
  size_t i;
  size_t after_pos;
  char msg_2 [58];
  char msg_1 [31];
  char msg [29];
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  pfn_allocate in_stack_fffffffffffffcf8;
  Location *in_stack_fffffffffffffd00;
  undefined1 *in_stack_fffffffffffffd28;
  Tree *in_stack_fffffffffffffd30;
  Tree *in_stack_fffffffffffffd38;
  pfn_free *in_stack_fffffffffffffd48;
  pfn_error in_stack_fffffffffffffd50;
  ulong local_290;
  char *local_288;
  ulong local_280;
  char *local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  pfn_allocate local_250;
  char local_248 [32];
  long local_228;
  size_t local_220;
  char *local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  pfn_allocate local_1f0;
  char local_1e8 [48];
  ulong local_1b8;
  char *local_1b0;
  ulong local_1a8;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  pfn_allocate in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffe90;
  Tree *in_stack_fffffffffffffe98;
  Tree *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  Tree *in_stack_fffffffffffffed0;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  pfn_allocate local_110;
  Tree local_108;
  char *local_8;
  
  local_108.m_tag_directives[0].prefix.str = in_R8;
  local_108.m_tag_directives[0].prefix.len = (size_t)in_RCX;
  if (in_RDX == -1) {
    local_108.m_callbacks.m_free = (pfn_free)0x6166206b63656863;
    local_108.m_callbacks.m_error = (pfn_error)0x6e28203a64656c69;
    local_108.m_tag_directives[0].handle.str = (char *)0x4e203d212065646f;
    local_108.m_tag_directives[0].handle.len._0_4_ = 0x29454e4f;
    local_108.m_tag_directives[0].handle.len._4_1_ = 0;
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    in_stack_fffffffffffffd50 = (in_RDI->m_callbacks).m_error;
    in_stack_fffffffffffffd48 = &local_108.m_callbacks.m_free;
    Location::Location(in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    in_stack_fffffffffffffce8 = (undefined4)local_108.m_arena_pos;
    in_stack_fffffffffffffcec = (undefined4)(local_108.m_arena_pos >> 0x20);
    in_stack_fffffffffffffcf0 = SUB84(local_108.m_callbacks.m_user_data,0);
    in_stack_fffffffffffffcf4 = (undefined4)((ulong)local_108.m_callbacks.m_user_data >> 0x20);
    in_stack_fffffffffffffcd8 = SUB84(local_108.m_arena.str,0);
    in_stack_fffffffffffffcdc = (undefined4)((ulong)local_108.m_arena.str >> 0x20);
    in_stack_fffffffffffffce0 = (undefined4)local_108.m_arena.len;
    in_stack_fffffffffffffce4 = (undefined4)(local_108.m_arena.len >> 0x20);
    LVar2.super_LineCol.line._0_4_ = in_stack_fffffffffffffce0;
    LVar2.super_LineCol.offset = (size_t)local_108.m_arena.str;
    LVar2.super_LineCol.line._4_4_ = in_stack_fffffffffffffce4;
    LVar2.super_LineCol.col._0_4_ = in_stack_fffffffffffffce8;
    LVar2.super_LineCol.col._4_4_ = in_stack_fffffffffffffcec;
    LVar2.name.str._0_4_ = in_stack_fffffffffffffcf0;
    LVar2.name.str._4_4_ = in_stack_fffffffffffffcf4;
    LVar2.name.len = (size_t)local_108.m_callbacks.m_allocate;
    (*in_stack_fffffffffffffd50)
              ((char *)in_stack_fffffffffffffd48,0x1d,LVar2,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffcf8 = local_108.m_callbacks.m_allocate;
  }
  if ((char *)local_108.m_tag_directives[0].prefix.len == (char *)0xffffffffffffffff) {
    local_108.m_buf = (NodeData *)0x6166206b63656863;
    local_108.m_cap._0_1_ = 'i';
    local_108.m_cap._1_1_ = 'l';
    local_108.m_cap._2_1_ = 'e';
    local_108.m_cap._3_1_ = 'd';
    local_108.m_cap._4_1_ = ':';
    local_108.m_cap._5_1_ = ' ';
    local_108.m_cap._6_1_ = '(';
    local_108.m_cap._7_1_ = 'p';
    local_108.m_size._0_1_ = 'a';
    local_108.m_size._1_1_ = 'r';
    local_108.m_size._2_1_ = 'e';
    local_108.m_size._3_1_ = 'n';
    local_108.m_size._4_1_ = 't';
    local_108.m_size._5_1_ = ' ';
    local_108.m_size._6_1_ = '!';
    local_108.m_size._7_1_ = '=';
    local_108.m_free_head._0_4_ = 0x4e4f4e20;
    local_108.m_free_head._4_2_ = 0x2945;
    local_108.m_free_head._6_1_ = 0;
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_callbacks).m_error;
    in_stack_fffffffffffffd38 = &local_108;
    Location::Location(in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    in_stack_fffffffffffffce8 = (undefined4)local_120;
    in_stack_fffffffffffffcec = (undefined4)((ulong)local_120 >> 0x20);
    in_stack_fffffffffffffcf0 = (undefined4)uStack_118;
    in_stack_fffffffffffffcf4 = (undefined4)((ulong)uStack_118 >> 0x20);
    in_stack_fffffffffffffcd8 = SUB84(in_stack_fffffffffffffed0,0);
    in_stack_fffffffffffffcdc = (undefined4)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    in_stack_fffffffffffffce0 = (undefined4)uStack_128;
    in_stack_fffffffffffffce4 = (undefined4)((ulong)uStack_128 >> 0x20);
    LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffffce0;
    LVar3.super_LineCol.offset = (size_t)in_stack_fffffffffffffed0;
    LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffffce4;
    LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffffce8;
    LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffffcec;
    LVar3.name.str._0_4_ = in_stack_fffffffffffffcf0;
    LVar3.name.str._4_4_ = in_stack_fffffffffffffcf4;
    LVar3.name.len = (size_t)local_110;
    (*p_Var1)((char *)in_stack_fffffffffffffd38,0x1f,LVar3,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffcf8 = local_110;
  }
  if ((local_108.m_tag_directives[0].prefix.str != (char *)0xffffffffffffffff) &&
     (bVar6 = has_child((Tree *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                        CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),0x3932f0),
     !bVar6)) {
    memcpy(&stack0xfffffffffffffe88,"check failed: (after == NONE || has_child(parent, after))",0x3a
          );
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      trap_instruction();
    }
    in_stack_fffffffffffffd30 = (Tree *)(in_RDI->m_callbacks).m_error;
    in_stack_fffffffffffffd28 = &stack0xfffffffffffffe88;
    Location::Location(in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    in_stack_fffffffffffffcf8 = in_stack_fffffffffffffe80;
    in_stack_fffffffffffffe80 = in_stack_fffffffffffffcf8;
    (*(code *)in_stack_fffffffffffffd30)
              (in_stack_fffffffffffffd28,0x3a,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffcd8 = local_1a0;
    in_stack_fffffffffffffcdc = uStack_19c;
    in_stack_fffffffffffffce0 = uStack_198;
    in_stack_fffffffffffffce4 = uStack_194;
    in_stack_fffffffffffffce8 = local_190;
    in_stack_fffffffffffffcec = uStack_18c;
    in_stack_fffffffffffffcf0 = uStack_188;
    in_stack_fffffffffffffcf4 = uStack_184;
  }
  local_1a8 = 0xffffffffffffffff;
  if (local_108.m_tag_directives[0].prefix.str != (char *)0xffffffffffffffff) {
    local_1b0 = (char *)first_child((Tree *)CONCAT44(in_stack_fffffffffffffce4,
                                                     in_stack_fffffffffffffce0),
                                    CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    local_1b8 = 0;
    while (local_1b0 != (char *)0xffffffffffffffff) {
      if (local_1b0 == local_108.m_tag_directives[0].prefix.str) {
        local_1a8 = local_1b8;
        break;
      }
      local_1b8 = local_1b8 + 1;
      local_1b0 = (char *)next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffce4,
                                                        in_stack_fffffffffffffce0),
                                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                                      );
    }
    if (local_1a8 == 0xffffffffffffffff) {
      memcpy(local_1e8,"check failed: (after_pos != NONE)",0x22);
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        trap_instruction();
      }
      p_Var1 = (in_RDI->m_callbacks).m_error;
      Location::Location(in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                         CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                         CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      in_stack_fffffffffffffce8 = (undefined4)local_200;
      in_stack_fffffffffffffcec = (undefined4)((ulong)local_200 >> 0x20);
      in_stack_fffffffffffffcf0 = (undefined4)uStack_1f8;
      in_stack_fffffffffffffcf4 = (undefined4)((ulong)uStack_1f8 >> 0x20);
      in_stack_fffffffffffffcd8 = (undefined4)local_210;
      in_stack_fffffffffffffcdc = (undefined4)((ulong)local_210 >> 0x20);
      in_stack_fffffffffffffce0 = (undefined4)uStack_208;
      in_stack_fffffffffffffce4 = (undefined4)((ulong)uStack_208 >> 0x20);
      LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffffce0;
      LVar4.super_LineCol.offset = local_210;
      LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffffce4;
      LVar4.super_LineCol.col._0_4_ = in_stack_fffffffffffffce8;
      LVar4.super_LineCol.col._4_4_ = in_stack_fffffffffffffcec;
      LVar4.name.str._0_4_ = in_stack_fffffffffffffcf0;
      LVar4.name.str._4_4_ = in_stack_fffffffffffffcf4;
      LVar4.name.len = (size_t)local_1f0;
      (*p_Var1)(local_1e8,0x22,LVar4,(in_RDI->m_callbacks).m_user_data);
      in_stack_fffffffffffffcf8 = local_1f0;
    }
  }
  local_218 = local_108.m_tag_directives[0].prefix.str;
  local_220 = first_child((Tree *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                          CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  local_228 = 0;
  do {
    if (local_220 == 0xffffffffffffffff) {
      return (size_t)local_218;
    }
    local_108.m_tag_directives[2].handle.str = (char *)local_108.m_tag_directives[0].prefix.len;
    local_108.m_tag_directives[2].prefix.str =
         (char *)_p(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
    if (((((NodeData *)local_108.m_tag_directives[2].prefix.str)->m_type).type & SEQ) == NOTYPE) {
      local_108.m_tag_directives[1].prefix.str = (char *)local_108.m_tag_directives[0].prefix.len;
      local_108.m_tag_directives[1].next_node_id =
           (size_t)_p(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
      if (((((NodeData *)local_108.m_tag_directives[1].next_node_id)->m_type).type & MAP) == NOTYPE)
      {
        builtin_strncpy(local_248,"check failed: (is_map(parent))",0x1f);
        eVar7 = get_error_flags();
        if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          trap_instruction();
        }
        p_Var1 = (in_RDI->m_callbacks).m_error;
        Location::Location(in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,
                           CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                           CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        in_stack_fffffffffffffce8 = (undefined4)local_260;
        in_stack_fffffffffffffcec = (undefined4)((ulong)local_260 >> 0x20);
        in_stack_fffffffffffffcf0 = (undefined4)uStack_258;
        in_stack_fffffffffffffcf4 = (undefined4)((ulong)uStack_258 >> 0x20);
        in_stack_fffffffffffffcd8 = (undefined4)local_270;
        in_stack_fffffffffffffcdc = (undefined4)((ulong)local_270 >> 0x20);
        in_stack_fffffffffffffce0 = (undefined4)uStack_268;
        in_stack_fffffffffffffce4 = (undefined4)((ulong)uStack_268 >> 0x20);
        LVar5.super_LineCol.line._0_4_ = in_stack_fffffffffffffce0;
        LVar5.super_LineCol.offset = local_270;
        LVar5.super_LineCol.line._4_4_ = in_stack_fffffffffffffce4;
        LVar5.super_LineCol.col._0_4_ = in_stack_fffffffffffffce8;
        LVar5.super_LineCol.col._4_4_ = in_stack_fffffffffffffcec;
        LVar5.name.str._0_4_ = in_stack_fffffffffffffcf0;
        LVar5.name.str._4_4_ = in_stack_fffffffffffffcf4;
        LVar5.name.len = (size_t)local_250;
        in_stack_fffffffffffffcf8 = local_250;
        (*p_Var1)(local_248,0x1f,LVar5,(in_RDI->m_callbacks).m_user_data);
      }
      local_278 = (char *)0xffffffffffffffff;
      local_280 = 0xffffffffffffffff;
      local_288 = (char *)first_child((Tree *)CONCAT44(in_stack_fffffffffffffce4,
                                                       in_stack_fffffffffffffce0),
                                      CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8))
      ;
      local_290 = 0;
      while (local_288 != (char *)0xffffffffffffffff) {
        in_stack_fffffffffffffd00 =
             (Location *)key(in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
        pcVar9 = key(in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30);
        local_108.m_tag_directives[2].prefix.len = (size_t)pcVar9->str;
        local_108.m_tag_directives[2].next_node_id = pcVar9->len;
        local_108.m_tag_directives[3].handle.str = (char *)in_stack_fffffffffffffd00;
        local_108.m_tag_directives[3].handle.len = local_108.m_tag_directives[2].prefix.len;
        local_108.m_tag_directives[3].prefix.str =
             (char *)local_108.m_tag_directives[2].next_node_id;
        local_108.m_tag_directives[3].prefix.len = (size_t)in_stack_fffffffffffffd00;
        local_108.m_tag_directives[3].next_node_id = local_108.m_tag_directives[2].prefix.len;
        local_8 = (char *)local_108.m_tag_directives[2].next_node_id;
        iVar8 = basic_substring<const_char>::compare
                          ((basic_substring<const_char> *)in_RDI,(char *)in_stack_fffffffffffffd50,
                           (size_t)in_stack_fffffffffffffd48);
        if (iVar8 == 0) {
          local_278 = local_288;
          local_280 = local_290;
          break;
        }
        local_290 = local_290 + 1;
        local_288 = (char *)next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffce4,
                                                          in_stack_fffffffffffffce0),
                                         CONCAT44(in_stack_fffffffffffffcdc,
                                                  in_stack_fffffffffffffcd8));
      }
      if (local_278 == (char *)0xffffffffffffffff) {
        local_218 = (char *)duplicate(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                      in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                                      (size_t)in_stack_fffffffffffffe80);
      }
      else if ((local_1a8 == 0xffffffffffffffff) || (local_1a8 <= local_280)) {
        if (local_218 == (char *)0xffffffffffffffff) {
          local_218 = local_278;
        }
        else if (local_278 != local_218) {
          move(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          local_218 = local_278;
        }
      }
      else {
        remove(in_RDI,local_278);
        local_218 = (char *)duplicate(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                      in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                                      (size_t)in_stack_fffffffffffffe80);
      }
    }
    else {
      local_218 = (char *)duplicate((Tree *)CONCAT44(in_stack_fffffffffffffcf4,
                                                     in_stack_fffffffffffffcf0),
                                    CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                                    CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                    CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    }
    local_228 = local_228 + 1;
    local_220 = next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  } while( true );
}

Assistant:

size_t Tree::duplicate_children_no_rep(Tree const *src, size_t node, size_t parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, after == NONE || has_child(parent, after));

    // don't loop using pointers as there may be a relocation

    // find the position where "after" is
    size_t after_pos = NONE;
    if(after != NONE)
    {
        for(size_t i = first_child(parent), icount = 0; i != NONE; ++icount, i = next_sibling(i))
        {
            if(i == after)
            {
                after_pos = icount;
                break;
            }
        }
        _RYML_CB_ASSERT(m_callbacks, after_pos != NONE);
    }

    // for each child to be duplicated...
    size_t prev = after;
    for(size_t i = src->first_child(node), icount = 0; i != NONE; ++icount, i = src->next_sibling(i))
    {
        if(is_seq(parent))
        {
            prev = duplicate(i, parent, prev);
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, is_map(parent));
            // does the parent already have a node with key equal to that of the current duplicate?
            size_t rep = NONE, rep_pos = NONE;
            for(size_t j = first_child(parent), jcount = 0; j != NONE; ++jcount, j = next_sibling(j))
            {
                if(key(j) == key(i))
                {
                    rep = j;
                    rep_pos = jcount;
                    break;
                }
            }
            if(rep == NONE) // there is no repetition; just duplicate
            {
                prev = duplicate(src, i, parent, prev);
            }
            else  // yes, there is a repetition
            {
                if(after_pos != NONE && rep_pos < after_pos)
                {
                    // rep is located before the node which will be inserted,
                    // and will be overridden by the duplicate. So replace it.
                    remove(rep);
                    prev = duplicate(src, i, parent, prev);
                }
                else if(prev == NONE)
                {
                    // first iteration with prev = after = NONE and repetition
                    prev = rep;
                }
                else if(rep != prev)
                {
                    // rep is located after the node which will be inserted
                    // and overrides it. So move the rep into this node's place.
                    move(rep, prev);
                    prev = rep;
                }
            } // there's a repetition
        }
    }

    return prev;
}